

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialDistribution.hpp
# Opt level: O1

void __thiscall
njoy::ENDFtk::section::Type<5>::PartialDistribution::~PartialDistribution(PartialDistribution *this)

{
  pointer pdVar1;
  pointer plVar2;
  
  std::__detail::__variant::
  _Variant_storage<false,_njoy::ENDFtk::section::Type<5>::TabulatedSpectrum,_njoy::ENDFtk::section::Type<5>::GeneralEvaporationSpectrum,_njoy::ENDFtk::section::Type<5>::MaxwellianFissionSpectrum,_njoy::ENDFtk::section::Type<5>::EvaporationSpectrum,_njoy::ENDFtk::section::Type<5>::WattSpectrum,_njoy::ENDFtk::section::Type<5>::MadlandNixSpectrum>
  ::~_Variant_storage((_Variant_storage<false,_njoy::ENDFtk::section::Type<5>::TabulatedSpectrum,_njoy::ENDFtk::section::Type<5>::GeneralEvaporationSpectrum,_njoy::ENDFtk::section::Type<5>::MaxwellianFissionSpectrum,_njoy::ENDFtk::section::Type<5>::EvaporationSpectrum,_njoy::ENDFtk::section::Type<5>::WattSpectrum,_njoy::ENDFtk::section::Type<5>::MadlandNixSpectrum>
                       *)&this->distribution_);
  pdVar1 = (this->probability_).super_TabulationRecord.yValues.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1,(long)(this->probability_).super_TabulationRecord.yValues.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar1);
  }
  pdVar1 = (this->probability_).super_TabulationRecord.xValues.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1,(long)(this->probability_).super_TabulationRecord.xValues.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar1);
  }
  plVar2 = (this->probability_).super_TabulationRecord.super_InterpolationBase.
           interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (plVar2 != (pointer)0x0) {
    operator_delete(plVar2,(long)*(pointer *)
                                  ((long)&(this->probability_).super_TabulationRecord.
                                          super_InterpolationBase.interpolationSchemeIndices.
                                          super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                          super__Vector_impl_data + 0x10) - (long)plVar2);
  }
  plVar2 = (this->probability_).super_TabulationRecord.super_InterpolationBase.boundaryIndices.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  if (plVar2 != (pointer)0x0) {
    operator_delete(plVar2,(long)*(pointer *)
                                  ((long)&(this->probability_).super_TabulationRecord.
                                          super_InterpolationBase.boundaryIndices.
                                          super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                          super__Vector_impl_data + 0x10) - (long)plVar2);
    return;
  }
  return;
}

Assistant:

class ENDFTK_PYTHON_EXPORT PartialDistribution {

  Probability probability_;
  Distribution distribution_;

  /* auxiliary functions */
  #include "ENDFtk/section/5/PartialDistribution/src/verifyLF.hpp"
  #include "ENDFtk/section/5/PartialDistribution/src/readPartialDistribution.hpp"

public:

  /* constructor */
  #include "ENDFtk/section/5/PartialDistribution/src/ctor.hpp"

  /* get methods */

  /**
   *  @brief Return the constant that defines the upper energy
   *         limit E - U for the secondary particle's energy E'
   */
  double U() const { return this->probability_.U(); }

  /**
   *  @brief Return the constant that defines the upper energy
   *         limit E - U for the secondary particle's energy E'
   */
  double energyLimitConstant() const { return this->U(); }

  /**
   *  @brief Return the probability
   */
  const Probability& probability() const { return this->probability_; }

  /**
   *  @brief Return the distribution
   */
  const Distribution& distribution() const { return this->distribution_; }

  #include "ENDFtk/section/5/PartialDistribution/src/NC.hpp"
  #include "ENDFtk/section/5/PartialDistribution/src/print.hpp"
}